

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

vector<char,_std::allocator<char>_> * __thiscall
cmELFInternalImpl<cmELFTypes64>::EncodeDynamicEntries
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,
          cmELFInternalImpl<cmELFTypes64> *this,DynamicEntryList *entries)

{
  long lVar1;
  ulong uVar2;
  pointer ppVar3;
  ELF_Dyn dyn;
  undefined8 local_58;
  undefined8 local_50;
  vector<char,std::allocator<char>> *local_48;
  cmELFInternalImpl<cmELFTypes64> *local_40;
  ulong local_38;
  
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = (vector<char,std::allocator<char>> *)__return_storage_ptr__;
  std::vector<char,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             (long)(entries->
                   super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(entries->
                   super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
  ppVar3 = (entries->
           super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = this;
  if (ppVar3 != (entries->
                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      lVar1 = ppVar3->first;
      uVar2 = ppVar3->second;
      local_58 = lVar1;
      local_50 = uVar2;
      if ((this->super_cmELFInternal).NeedSwap == true) {
        local_38 = uVar2 >> 0x20;
        local_58 = CONCAT35(CONCAT21(CONCAT11((char)lVar1,(char)((ulong)lVar1 >> 8)),
                                     (char)((ulong)lVar1 >> 0x10)),
                            CONCAT14((char)((ulong)lVar1 >> 0x18),
                                     CONCAT13((char)((ulong)lVar1 >> 0x20),
                                              CONCAT12((char)((ulong)lVar1 >> 0x28),
                                                       CONCAT11((char)((ulong)lVar1 >> 0x30),
                                                                (char)((ulong)lVar1 >> 0x38))))));
        local_50 = CONCAT35(CONCAT21(CONCAT11((char)uVar2,(char)(uVar2 >> 8)),(char)(uVar2 >> 0x10))
                            ,CONCAT14((char)(uVar2 >> 0x18),
                                      CONCAT13((char)(uVar2 >> 0x20),
                                               CONCAT12((char)(uVar2 >> 0x28),
                                                        CONCAT11((char)(uVar2 >> 0x30),
                                                                 (char)(uVar2 >> 0x38))))));
        __return_storage_ptr__ = (vector<char,_std::allocator<char>_> *)local_48;
        this = local_40;
      }
      std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                ((vector<char,std::allocator<char>> *)__return_storage_ptr__,
                 *(undefined8 *)((long)__return_storage_ptr__ + 8),&local_58,&local_48);
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != (entries->
                       super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return (vector<char,_std::allocator<char>_> *)
         (vector<char,std::allocator<char>> *)__return_storage_ptr__;
}

Assistant:

std::vector<char> cmELFInternalImpl<Types>::EncodeDynamicEntries(
  const cmELF::DynamicEntryList& entries)
{
  std::vector<char> result;
  result.reserve(sizeof(ELF_Dyn) * entries.size());

  for (cmELF::DynamicEntryList::const_iterator it = entries.begin();
       it != entries.end(); it++) {
    // Store the entry in an ELF_Dyn, byteswap it, then serialize to chars
    ELF_Dyn dyn;
    dyn.d_tag = static_cast<tagtype>(it->first);
    dyn.d_un.d_val = static_cast<tagtype>(it->second);

    if (this->NeedSwap) {
      ByteSwap(dyn);
    }

    char* pdyn = reinterpret_cast<char*>(&dyn);
    result.insert(result.end(), pdyn, pdyn + sizeof(ELF_Dyn));
  }

  return result;
}